

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigOutDec.c
# Opt level: O3

Vec_Ptr_t * Saig_ManFindPrimes(Aig_Man_t *pAig,int nLits,int fVerbose)

{
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  Cnf_Dat_t *p;
  sat_solver *s;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  int *__ptr_00;
  void *__s;
  Vec_Int_t *pVVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  Aig_Obj_t *pRoot;
  int Lits [10];
  ulong local_c8;
  ulong local_c0;
  Aig_Obj_t *local_78;
  Vec_Int_t *local_70;
  long local_68;
  long local_60;
  int local_58;
  int local_54;
  int local_50;
  lit local_4c [7];
  
  if (1 < nLits - 1U) {
    __assert_fail("nLits == 1 || nLits == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigOutDec.c"
                  ,0x38,"Vec_Ptr_t *Saig_ManFindPrimes(Aig_Man_t *, int, int)");
  }
  p = Cnf_DeriveSimple(pAig,pAig->nObjs[3]);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  if (pAig->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar1 = *pAig->vCos->pArray;
  local_78 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe);
  __ptr = Aig_ManDfsNodes(pAig,&local_78,1);
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  iVar4 = __ptr->nSize;
  lVar13 = (long)iVar4;
  __ptr_00 = (int *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar10 = iVar4;
  }
  *__ptr_00 = iVar10;
  local_c0 = 0;
  if (iVar10 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar10 << 2);
  }
  *(void **)(__ptr_00 + 2) = __s;
  __ptr_00[1] = iVar4;
  memset(__s,0,lVar13 * 4);
  local_58 = p->pVarNums[*(int *)((long)pvVar1 + 0x24)] * 2 + 1;
  uVar14 = (ulong)(uint)__ptr->nSize;
  if (__ptr->nSize < 1) {
    local_c8 = 100;
  }
  else {
    local_c8 = 100;
    local_c0 = 0;
    lVar11 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)__ptr->pArray[lVar11];
      if (pAVar2 != local_78) {
        local_54 = (*(uint *)&pAVar2->field_0x18 >> 3 & 1) + p->pVarNums[pAVar2->Id] * 2;
        iVar4 = sat_solver_solve(s,&local_58,&local_50,0,0,0,0);
        if (iVar4 == -1) {
          pVVar8 = (Vec_Int_t *)malloc(0x10);
          pVVar8->nCap = 0x10;
          pVVar8->nSize = 0;
          piVar9 = (int *)malloc(0x40);
          pVVar8->pArray = piVar9;
          Vec_IntPush(pVVar8,(*(uint *)&pAVar2->field_0x18 >> 3 & 1) + pAVar2->Id * 2);
          iVar4 = (int)local_c8;
          if ((int)local_c0 == iVar4) {
            if (iVar4 < 0x10) {
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = 0x10;
              local_c8 = 0x10;
            }
            else {
              local_c8 = (ulong)(uint)(iVar4 * 2);
              if (pVVar6->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(local_c8 * 8);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar6->pArray,local_c8 * 8);
              }
              pVVar6->pArray = ppvVar7;
              pVVar6->nCap = iVar4 * 2;
            }
          }
          else {
            ppvVar7 = pVVar6->pArray;
          }
          pVVar6->nSize = (int)local_c0 + 1U;
          ppvVar7[(int)local_c0] = pVVar8;
          if (fVerbose != 0) {
            printf("Adding prime %d%c\n",(ulong)(uint)pAVar2->Id,
                   (ulong)(((*(uint *)&pAVar2->field_0x18 & 8) >> 2) + 0x2b));
          }
          if (lVar13 <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)(__ptr_00 + 2) + lVar11 * 4) = 1;
          local_c0 = (ulong)((int)local_c0 + 1U);
        }
      }
      lVar11 = lVar11 + 1;
      uVar14 = (ulong)__ptr->nSize;
    } while (lVar11 < (long)uVar14);
  }
  iVar10 = (int)local_c0;
  iVar4 = iVar10;
  if ((1 < nLits) && (0 < (int)uVar14)) {
    lVar12 = 1;
    lVar11 = 0;
    uVar15 = local_c0;
    do {
      pAVar2 = (Aig_Obj_t *)__ptr->pArray[lVar11];
      local_68 = lVar11 + 1;
      local_60 = lVar12;
      if ((pAVar2 != local_78) && (local_68 < (int)uVar14)) {
        do {
          pAVar3 = (Aig_Obj_t *)__ptr->pArray[lVar12];
          iVar4 = (int)uVar15;
          if (pAVar3 != local_78) {
            if (lVar13 <= lVar11) {
LAB_00664262:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (*(int *)(*(long *)(__ptr_00 + 2) + lVar11 * 4) == 0) {
              if (lVar13 <= lVar12) goto LAB_00664262;
              if (*(int *)(*(long *)(__ptr_00 + 2) + lVar12 * 4) == 0) {
                uVar16 = 0;
                do {
                  local_54 = ((*(uint *)&pAVar2->field_0x18 >> 3 ^ uVar16) & 1) +
                             p->pVarNums[pAVar2->Id] * 2;
                  local_50 = (uint)(uVar16 >> 1 !=
                                   (uint)((*(uint *)&pAVar3->field_0x18 >> 3 & 1) != 0)) +
                             p->pVarNums[pAVar3->Id] * 2;
                  iVar5 = sat_solver_solve(s,&local_58,local_4c,0,0,0,0);
                  if (iVar5 == -1) {
                    pVVar8 = (Vec_Int_t *)malloc(0x10);
                    pVVar8->nCap = 0x10;
                    pVVar8->nSize = 0;
                    piVar9 = (int *)malloc(0x40);
                    pVVar8->pArray = piVar9;
                    Vec_IntPush(pVVar8,((*(uint *)&pAVar2->field_0x18 >> 3 ^ uVar16) & 1) +
                                       pAVar2->Id * 2);
                    local_70 = pVVar8;
                    Vec_IntPush(pVVar8,(uint)(uVar16 >> 1 !=
                                             (uint)((*(uint *)&pAVar3->field_0x18 >> 3 & 1) != 0)) +
                                       pAVar3->Id * 2);
                    iVar5 = (int)local_c8;
                    if (iVar4 == iVar5) {
                      if (iVar5 < 0x10) {
                        if (pVVar6->pArray == (void **)0x0) {
                          ppvVar7 = (void **)malloc(0x80);
                        }
                        else {
                          ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
                        }
                        pVVar6->pArray = ppvVar7;
                        pVVar6->nCap = 0x10;
                        local_c8 = 0x10;
                      }
                      else {
                        local_c8 = (ulong)(uint)(iVar5 * 2);
                        if (pVVar6->pArray == (void **)0x0) {
                          ppvVar7 = (void **)malloc(local_c8 * 8);
                        }
                        else {
                          ppvVar7 = (void **)realloc(pVVar6->pArray,local_c8 * 8);
                        }
                        pVVar6->pArray = ppvVar7;
                        pVVar6->nCap = iVar5 * 2;
                      }
                    }
                    else {
                      ppvVar7 = pVVar6->pArray;
                    }
                    uVar15 = (ulong)(iVar4 + 1U);
                    pVVar6->nSize = iVar4 + 1U;
                    ppvVar7[iVar4] = local_70;
                    if (fVerbose != 0) {
                      printf("Adding prime %d%c %d%c\n",(ulong)(uint)pAVar2->Id,
                             (ulong)(((*(uint *)&pAVar2->field_0x18 >> 3 ^ uVar16) & 1) * 2 + 0x2b),
                             (ulong)(uint)pAVar3->Id);
                    }
                    break;
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 != 3);
              }
            }
          }
          lVar12 = lVar12 + 1;
          uVar14 = (ulong)(uint)__ptr->nSize;
        } while ((int)lVar12 < __ptr->nSize);
      }
      lVar12 = local_60 + 1;
      iVar4 = (int)uVar15;
      lVar11 = local_68;
    } while (local_68 < (int)uVar14);
  }
  printf("Property cone size = %6d    1-lit primes = %5d    2-lit primes = %5d\n",uVar14,local_c0,
         (ulong)(uint)(iVar4 - iVar10));
  sat_solver_delete(s);
  Cnf_DataFree(p);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  return pVVar6;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs decomposition of the property output.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Ptr_t * Saig_ManFindPrimes( Aig_Man_t * pAig, int nLits, int fVerbose )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj0, * pObj1, * pRoot, * pMiter;
    Vec_Ptr_t * vPrimes, * vNodes;
    Vec_Int_t * vCube, * vMarks;
    int i0, i1, m, RetValue, Lits[10];
    int fCompl0, fCompl1, nNodes1, nNodes2;
    assert( nLits == 1 || nLits == 2 );
    assert( nLits < 10 );

    // create SAT solver
    pCnf = Cnf_DeriveSimple( pAig, Aig_ManCoNum(pAig) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );

    // collect nodes in the property output cone
    pMiter = Aig_ManCo( pAig, 0 );
    pRoot  = Aig_ObjFanin0( pMiter );
    vNodes = Aig_ManDfsNodes( pAig, &pRoot, 1 );
    // sort nodes by level and remove the last few
 
    // try single nodes
    vPrimes = Vec_PtrAlloc( 100 );
    // create assumptions
    vMarks = Vec_IntStart( Vec_PtrSize(vNodes) );
    Lits[0] = toLitCond( pCnf->pVarNums[Aig_ObjId(pMiter)], 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj0, i0 )
    if ( pObj0 != pRoot )
    {
        // create assumptions
        Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj0)], pObj0->fPhase );
        // solve the problem
        RetValue = sat_solver_solve( pSat, Lits, Lits+2, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue == l_False )
        {
            vCube = Vec_IntAlloc( 1 );
            Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj0), pObj0->fPhase) );
            Vec_PtrPush( vPrimes, vCube );
            if ( fVerbose )
            printf( "Adding prime %d%c\n", Aig_ObjId(pObj0),  pObj0->fPhase?'-':'+' );
            Vec_IntWriteEntry( vMarks, i0, 1 );
        }
    }
    nNodes1 = Vec_PtrSize(vPrimes);
    if ( nLits > 1 )
    {
        // try adding second literal
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj0, i0 )
        if ( pObj0 != pRoot )
        Vec_PtrForEachEntryStart( Aig_Obj_t *, vNodes, pObj1, i1, i0+1 )
        if ( pObj1 != pRoot )
        {
            if ( Vec_IntEntry(vMarks,i0) || Vec_IntEntry(vMarks,i1) )
                continue;
            for ( m = 0; m < 3; m++ )
            {
                fCompl0 =  m & 1;
                fCompl1 = (m >> 1) & 1;
                // create assumptions
                Lits[1] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj0)], fCompl0 ^ pObj0->fPhase );
                Lits[2] = toLitCond( pCnf->pVarNums[Aig_ObjId(pObj1)], fCompl1 ^ pObj1->fPhase );
                // solve the problem
                RetValue = sat_solver_solve( pSat, Lits, Lits+3, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( RetValue == l_False )
                {
                    vCube = Vec_IntAlloc( 2 );
                    Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj0), fCompl0 ^ pObj0->fPhase) );
                    Vec_IntPush( vCube, toLitCond(Aig_ObjId(pObj1), fCompl1 ^ pObj1->fPhase) );
                    Vec_PtrPush( vPrimes, vCube );
                    if ( fVerbose )
                    printf( "Adding prime %d%c %d%c\n", 
                        Aig_ObjId(pObj0), (fCompl0 ^ pObj0->fPhase)?'-':'+', 
                        Aig_ObjId(pObj1), (fCompl1 ^ pObj1->fPhase)?'-':'+' );
                    break;
                }
            }
        }
    }
    nNodes2 = Vec_PtrSize(vPrimes) - nNodes1;

    printf( "Property cone size = %6d    1-lit primes = %5d    2-lit primes = %5d\n", 
        Vec_PtrSize(vNodes), nNodes1, nNodes2 );

    // clean up
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vMarks );
    return vPrimes;
}